

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void ftgkys_(int *A1,char *A2,char *A3,char *A4,int *A5,size_t C2,size_t C3,size_t C4)

{
  fitsfile *fptr;
  int *piVar1;
  char *__dest;
  void *pvVar2;
  char *s;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t local_d0;
  size_t local_98;
  unsigned_long local_80;
  char *local_70;
  char *local_68;
  char *local_60;
  char *B4;
  char *B3;
  char *B2;
  size_t C2_local;
  int *A5_local;
  char *A4_local;
  char *A3_local;
  char *A2_local;
  int *A1_local;
  
  B3 = (char *)0x0;
  B4 = (char *)0x0;
  fptr = gFitsFiles[*A1];
  B2 = (char *)C2;
  C2_local = (size_t)A5;
  A5_local = (int *)A4;
  A4_local = A3;
  A3_local = A2;
  A2_local = (char *)A1;
  if ((((C2 < 4) || (*A2 != '\0')) || (A2[1] != '\0')) || ((A2[2] != '\0' || (A2[3] != '\0')))) {
    pvVar2 = memchr(A2,0,C2);
    if (pvVar2 == (void *)0x0) {
      if (gMinStrLen < B2) {
        local_70 = B2;
      }
      else {
        local_70 = (char *)gMinStrLen;
      }
      B3 = (char *)malloc((size_t)(local_70 + 1));
      B3[(long)B2] = '\0';
      memcpy(B3,A3_local,(size_t)B2);
      local_68 = kill_trailing(B3,' ');
    }
    else {
      local_68 = A3_local;
    }
    local_60 = local_68;
  }
  else {
    local_60 = (char *)0x0;
  }
  if (gMinStrLen < C4) {
    local_80 = C4;
  }
  else {
    local_80 = gMinStrLen;
  }
  s = (char *)malloc(local_80 + 1);
  s[C4] = '\0';
  memcpy(s,A5_local,C4);
  pcVar3 = kill_trailing(s,' ');
  ffgkls(fptr,local_60,&B4,pcVar3,(int *)C2_local);
  if (B3 != (char *)0x0) {
    free(B3);
  }
  __dest = A4_local;
  pcVar3 = B4;
  if (B4 != (char *)0x0) {
    sVar4 = strlen(B4);
    if (sVar4 < C3) {
      local_98 = strlen(B4);
    }
    else {
      local_98 = C3;
    }
    memcpy(__dest,pcVar3,local_98);
    sVar4 = strlen(B4);
    pcVar3 = A4_local;
    if (sVar4 < C3) {
      sVar4 = strlen(B4);
      sVar5 = strlen(B4);
      memset(pcVar3 + sVar4,0x20,C3 - sVar5);
    }
    free(B4);
  }
  piVar1 = A5_local;
  if (s != (char *)0x0) {
    sVar4 = strlen(s);
    if (sVar4 < C4) {
      local_d0 = strlen(s);
    }
    else {
      local_d0 = C4;
    }
    memcpy(piVar1,s,local_d0);
    sVar4 = strlen(s);
    piVar1 = A5_local;
    if (sVar4 < C4) {
      sVar4 = strlen(s);
      sVar5 = strlen(s);
      memset((void *)((long)piVar1 + sVar4),0x20,C4 - sVar5);
    }
    free(s);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTGKYS,ftgkys)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,STRING,PSTRING,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(STRING,2)
   QCF(PSTRING,3)   /*  Defines a character pointer  */
   QCF(PSTRING,4)
   QCF(PINT,5)

   ffgkls( TCF(ftgkys,FITSUNIT,1,0)
           TCF(ftgkys,STRING,2,1)
           , &B3                        /*  Pass address of pointer  */
           TCF(ftgkys,PSTRING,4,1)
           TCF(ftgkys,PINT,5,1)     );

   RCF(FITSUNIT,1)
   RCF(STRING,2)
   RCF(PSTRING,3)      /*  Copies as much of pointer as will fit   */
   RCF(PSTRING,4)      /*     into fortran string and frees space  */
   RCF(PINT,5)
}